

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variablesio.cpp
# Opt level: O1

void __thiscall
bal::VariableTextReader::read_variable_sequence_
          (VariableTextReader *this,uint *sequence_size,int *step_size)

{
  TextReader *pTVar1;
  _func_int **pp_Var2;
  _func_int *p_Var3;
  uint32_t uVar4;
  int32_t iVar5;
  ulong uVar6;
  long lVar7;
  
  *sequence_size = 1;
  *step_size = 0;
  pp_Var2 = this->_vptr_VariableTextReader;
  p_Var3 = pp_Var2[-3];
  uVar6 = *(ulong *)(&this->field_0x8 + (long)p_Var3);
  if (uVar6 < *(ulong *)(&this->field_0x20 + (long)p_Var3)) {
    lVar7 = *(long *)(&this->field_0x10 + (long)p_Var3);
    do {
      uVar6 = uVar6 + 1;
      if (*(char *)(*(long *)(&this->field_0x18 + (long)p_Var3) + -1 + uVar6) != ' ') break;
      *(ulong *)(&this->field_0x8 + (long)p_Var3) = uVar6;
      if (lVar7 != 0) {
        *(undefined8 *)(&this->field_0x10 + (long)p_Var3) = 0;
        *(undefined4 *)(&this->field_0x40 + (long)p_Var3) = 0;
        lVar7 = 0;
      }
    } while (uVar6 != *(ulong *)(&this->field_0x20 + (long)p_Var3));
  }
  p_Var3 = pp_Var2[-3];
  pTVar1 = (TextReader *)((long)&this->_vptr_VariableTextReader + (long)p_Var3);
  TextReader::load_next_token(pTVar1);
  if ((*(long *)(&this->field_0x10 + (long)p_Var3) != 0) &&
     ((pTVar1->current_line_)._M_dataplus._M_p[pTVar1->current_token_pos_] == '/')) {
    pp_Var2 = this->_vptr_VariableTextReader;
    p_Var3 = pp_Var2[-3];
    if (*(long *)(&this->field_0x10 + (long)p_Var3) != 0) {
      *(long *)(&this->field_0x8 + (long)p_Var3) = *(long *)(&this->field_0x8 + (long)p_Var3) + 1;
      *(undefined8 *)(&this->field_0x10 + (long)p_Var3) = 0;
      *(undefined4 *)(&this->field_0x40 + (long)p_Var3) = 0;
    }
    p_Var3 = pp_Var2[-3];
    uVar6 = *(ulong *)(&this->field_0x8 + (long)p_Var3);
    if (uVar6 < *(ulong *)(&this->field_0x20 + (long)p_Var3)) {
      lVar7 = *(long *)(&this->field_0x10 + (long)p_Var3);
      do {
        uVar6 = uVar6 + 1;
        if (*(char *)(*(long *)(&this->field_0x18 + (long)p_Var3) + -1 + uVar6) != ' ') break;
        *(ulong *)(&this->field_0x8 + (long)p_Var3) = uVar6;
        if (lVar7 != 0) {
          *(undefined8 *)(&this->field_0x10 + (long)p_Var3) = 0;
          *(undefined4 *)(&this->field_0x40 + (long)p_Var3) = 0;
          lVar7 = 0;
        }
      } while (uVar6 != *(ulong *)(&this->field_0x20 + (long)p_Var3));
    }
    uVar4 = TextReader::read_uint32
                      ((TextReader *)((long)&this->_vptr_VariableTextReader + (long)pp_Var2[-3]),0,
                       0xffffffff);
    *sequence_size = uVar4;
    pp_Var2 = this->_vptr_VariableTextReader;
    p_Var3 = pp_Var2[-3];
    uVar6 = *(ulong *)(&this->field_0x8 + (long)p_Var3);
    if (uVar6 < *(ulong *)(&this->field_0x20 + (long)p_Var3)) {
      lVar7 = *(long *)(&this->field_0x10 + (long)p_Var3);
      do {
        uVar6 = uVar6 + 1;
        if (*(char *)(*(long *)(&this->field_0x18 + (long)p_Var3) + -1 + uVar6) != ' ') break;
        *(ulong *)(&this->field_0x8 + (long)p_Var3) = uVar6;
        if (lVar7 != 0) {
          *(undefined8 *)(&this->field_0x10 + (long)p_Var3) = 0;
          *(undefined4 *)(&this->field_0x40 + (long)p_Var3) = 0;
          lVar7 = 0;
        }
      } while (uVar6 != *(ulong *)(&this->field_0x20 + (long)p_Var3));
    }
    p_Var3 = pp_Var2[-3];
    pTVar1 = (TextReader *)((long)&this->_vptr_VariableTextReader + (long)p_Var3);
    TextReader::load_next_token(pTVar1);
    if ((*(long *)(&this->field_0x10 + (long)p_Var3) != 0) &&
       ((pTVar1->current_line_)._M_dataplus._M_p[pTVar1->current_token_pos_] == '/')) {
      pp_Var2 = this->_vptr_VariableTextReader;
      p_Var3 = pp_Var2[-3];
      if (*(long *)(&this->field_0x10 + (long)p_Var3) != 0) {
        *(long *)(&this->field_0x8 + (long)p_Var3) = *(long *)(&this->field_0x8 + (long)p_Var3) + 1;
        *(undefined8 *)(&this->field_0x10 + (long)p_Var3) = 0;
        *(undefined4 *)(&this->field_0x40 + (long)p_Var3) = 0;
      }
      p_Var3 = pp_Var2[-3];
      uVar6 = *(ulong *)(&this->field_0x8 + (long)p_Var3);
      if (uVar6 < *(ulong *)(&this->field_0x20 + (long)p_Var3)) {
        lVar7 = *(long *)(&this->field_0x10 + (long)p_Var3);
        do {
          uVar6 = uVar6 + 1;
          if (*(char *)(*(long *)(&this->field_0x18 + (long)p_Var3) + -1 + uVar6) != ' ') break;
          *(ulong *)(&this->field_0x8 + (long)p_Var3) = uVar6;
          if (lVar7 != 0) {
            *(undefined8 *)(&this->field_0x10 + (long)p_Var3) = 0;
            *(undefined4 *)(&this->field_0x40 + (long)p_Var3) = 0;
            lVar7 = 0;
          }
        } while (uVar6 != *(ulong *)(&this->field_0x20 + (long)p_Var3));
      }
      iVar5 = TextReader::read_sint32
                        ((TextReader *)((long)&this->_vptr_VariableTextReader + (long)pp_Var2[-3]));
      *step_size = iVar5;
      p_Var3 = this->_vptr_VariableTextReader[-3];
      uVar6 = *(ulong *)(&this->field_0x8 + (long)p_Var3);
      if (uVar6 < *(ulong *)(&this->field_0x20 + (long)p_Var3)) {
        lVar7 = *(long *)(&this->field_0x10 + (long)p_Var3);
        do {
          uVar6 = uVar6 + 1;
          if (*(char *)(*(long *)(&this->field_0x18 + (long)p_Var3) + -1 + uVar6) != ' ') {
            return;
          }
          *(ulong *)(&this->field_0x8 + (long)p_Var3) = uVar6;
          if (lVar7 != 0) {
            *(undefined8 *)(&this->field_0x10 + (long)p_Var3) = 0;
            *(undefined4 *)(&this->field_0x40 + (long)p_Var3) = 0;
            lVar7 = 0;
          }
        } while (uVar6 != *(ulong *)(&this->field_0x20 + (long)p_Var3));
      }
    }
  }
  return;
}

Assistant:

inline void VariableTextReader::read_variable_sequence_(unsigned int& sequence_size, signed int& step_size) {
        sequence_size = 1;
        step_size = 0;
        
        skip_space();
        if (is_symbol('/')) {
            skip_symbol();
            skip_space();
            sequence_size = read_uint32();
            skip_space();
            if (is_symbol('/')) {
                skip_symbol();
                skip_space();
                step_size = read_sint32();
                skip_space();
            };
        };
    }